

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::UTF16CollationIterator::nextCodePoint(UTF16CollationIterator *this,UErrorCode *param_1)

{
  UChar UVar1;
  UChar trail;
  UChar32 c;
  UErrorCode *param_1_local;
  UTF16CollationIterator *this_local;
  
  if (this->pos == this->limit) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = (uint)(ushort)*this->pos;
    if ((this_local._4_4_ == 0) && (this->limit == (UChar *)0x0)) {
      this->limit = this->pos;
      this_local._4_4_ = 0xffffffff;
    }
    else {
      this->pos = this->pos + 1;
      if (((this_local._4_4_ & 0xfffffc00) == 0xd800) &&
         ((this->pos != this->limit && (UVar1 = *this->pos, (UVar1 & 0xfc00U) == 0xdc00)))) {
        this->pos = this->pos + 1;
        this_local._4_4_ = this_local._4_4_ * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UTF16CollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == limit) {
        return U_SENTINEL;
    }
    UChar32 c = *pos;
    if(c == 0 && limit == NULL) {
        limit = pos;
        return U_SENTINEL;
    }
    ++pos;
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}